

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

void __thiscall dg::llvmdg::LLVMPTACallGraphImpl::_build(LLVMPTACallGraphImpl *this)

{
  Function *parent;
  Function *B;
  Function *__range3;
  Function *pFVar1;
  StringRef SVar2;
  Function *entry;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> queue;
  Function *local_b8;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> local_b0;
  
  SVar2.Length = (size_t)(this->_pta->options).super_LLVMAnalysisOptions.entryFunction._M_dataplus.
                         _M_p;
  SVar2.Data = (char *)this->_module;
  local_b8 = (Function *)llvm::Module::getFunction(SVar2);
  GenericCallGraph<const_llvm::Function_*>::getOrCreate(&this->_cg,&local_b8);
  ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::SetQueue(&local_b0);
  ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push(&local_b0,&local_b8);
  while (local_b0._queue.Container.c.
         super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         local_b0._queue.Container.c.
         super__Deque_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    parent = ADT::QueueFIFO<const_llvm::Function_*>::pop(&local_b0._queue);
    for (pFVar1 = parent + 0x50; pFVar1 = *(Function **)pFVar1, pFVar1 != parent + 0x48;
        pFVar1 = pFVar1 + 8) {
      B = pFVar1 + -0x18;
      if (pFVar1 == (Function *)0x0) {
        B = (Function *)0x0;
      }
      processBBlock(this,parent,(BasicBlock *)B,&local_b0);
    }
  }
  ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::~SetQueue(&local_b0);
  return;
}

Assistant:

void _build() {
        auto *entry = _module->getFunction(_pta->getOptions().entryFunction);
        assert(entry && "Entry function not found");
        _cg.createNode(entry);

        ADT::SetQueue<QueueFIFO<const llvm::Function *>> queue;
        queue.push(entry);

        while (!queue.empty()) {
            const auto *cur = queue.pop();
            for (const auto &B : *cur) {
                processBBlock(cur, B, queue);
            }
        }
    }